

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::BuildMeshesForNode
          (ColladaLoader *this,ColladaParser *pParser,Node *pNode,aiNode *pTarget)

{
  bool bVar1;
  size_type sVar2;
  reference __x;
  pointer ppVar3;
  pointer ppVar4;
  SubMesh *pSVar5;
  const_reference pSubMesh;
  Logger *pLVar6;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar7;
  basic_formatter *pbVar8;
  pointer ppVar9;
  pointer ppVar10;
  reference pvVar11;
  pointer ppVar12;
  mapped_type_conflict3 *pmVar13;
  void *pvVar14;
  iterator iVar15;
  iterator iVar16;
  size_type local_4e8;
  aiMesh *local_4e0;
  aiMesh *dstMesh;
  _Rb_tree_const_iterator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_> local_4d0;
  iterator local_4c8;
  _Rb_tree_const_iterator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_> local_4c0;
  const_iterator dstMeshIt;
  ColladaMeshIndex index;
  pair<Assimp::Collada::Effect_*,_aiMaterial_*> *mat;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_460;
  uint local_454;
  iterator iStack_450;
  uint matIdx;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_448;
  const_iterator matIt;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_2c0;
  _Self local_2a0;
  SemanticMappingTable *local_298;
  SemanticMappingTable *table;
  const_iterator meshMatIt;
  string meshMaterial;
  SubMesh *submesh;
  size_t sm;
  size_t faceStart;
  size_t vertexStart;
  string local_d0;
  _Self local_b0;
  _Base_ptr local_a8;
  _Self local_a0;
  _Self local_98;
  const_iterator srcContrIt;
  _Self local_88;
  const_iterator srcMeshIt;
  Controller *srcController;
  Mesh *srcMesh;
  MeshInstance *mid;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_> *__range1;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newMeshRefs;
  aiNode *pTarget_local;
  Node *pNode_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pTarget;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  sVar2 = std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>
          ::size(&pNode->mMeshes);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,sVar2);
  __end1 = std::
           vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
           begin(&pNode->mMeshes);
  mid = (MeshInstance *)
        std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
        end(&pNode->mMeshes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Assimp::Collada::MeshInstance_*,_std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>_>
                                *)&mid);
    if (!bVar1) {
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
      *(int *)(newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage + 0x8c) = (int)sVar2;
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
      if (sVar2 != 0) {
        pvVar14 = operator_new__((ulong)(uint)newMeshRefs.
                                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              [0x8c] << 2);
        newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x8d] = (unsigned_long)pvVar14;
        iVar15 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
        iVar16 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
        std::
        transform<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_int*,Assimp::ColladaLoader::BuildMeshesForNode(Assimp::ColladaParser_const&,Assimp::Collada::Node_const*,aiNode*)::UIntTypeConverter>
                  (iVar15._M_current,iVar16._M_current,
                   newMeshRefs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage[0x8d]);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
      return;
    }
    __x = __gnu_cxx::
          __normal_iterator<const_Assimp::Collada::MeshInstance_*,_std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>_>
          ::operator*(&__end1);
    srcController = (Controller *)0x0;
    srcMeshIt._M_node = (_Base_ptr)0x0;
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
         ::find(&pParser->mMeshLibrary,&__x->mMeshOrController);
    srcContrIt._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
         ::end(&pParser->mMeshLibrary);
    bVar1 = std::operator==(&local_88,(_Self *)&srcContrIt);
    if (bVar1) {
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
           ::find(&pParser->mControllerLibrary,&__x->mMeshOrController);
      local_a0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
           ::end(&pParser->mControllerLibrary);
      bVar1 = std::operator!=(&local_98,&local_a0);
      if (bVar1) {
        ppVar3 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>
                 ::operator->(&local_98);
        srcMeshIt._M_node = (_Base_ptr)&ppVar3->second;
        local_a8 = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
                   ::find(&pParser->mMeshLibrary,&(ppVar3->second).mMeshId);
        local_88._M_node = local_a8;
        local_b0._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>_>
             ::end(&pParser->mMeshLibrary);
        bVar1 = std::operator!=(&local_88,&local_b0);
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>
                   ::operator->(&local_88);
          srcController = (Controller *)ppVar4->second;
        }
      }
      if (srcController != (Controller *)0x0) goto LAB_00652bee;
      pLVar6 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[42]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &vertexStart,(char (*) [42])"Collada: Unable to find geometry for ID \"");
      pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &vertexStart,&__x->mMeshOrController);
      pbVar8 = (basic_formatter *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar7,(char (*) [13])"\". Skipping.");
      Formatter::basic_formatter::operator_cast_to_string(&local_d0,pbVar8);
      Logger::warn(pLVar6,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &vertexStart);
    }
    else {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Mesh_*>_>
               ::operator->(&local_88);
      srcController = (Controller *)ppVar4->second;
LAB_00652bee:
      faceStart = 0;
      sm = 0;
      for (submesh = (SubMesh *)0x0;
          pSVar5 = (SubMesh *)
                   std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                   ::size((vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                           *)&srcController[1].mWeightInputWeights.mIndex), submesh < pSVar5;
          submesh = (SubMesh *)&(submesh->mMaterial).field_0x1) {
        pSubMesh = std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                   ::operator[]((vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                                 *)&srcController[1].mWeightInputWeights.mIndex,(size_type)submesh);
        if (pSubMesh->mNumFaces != 0) {
          std::__cxx11::string::string((string *)&meshMatIt);
          table = (SemanticMappingTable *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                  ::find(&__x->mMaterials,&pSubMesh->mMaterial);
          local_298 = (SemanticMappingTable *)0x0;
          local_2a0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
               ::end(&__x->mMaterials);
          bVar1 = std::operator!=((_Self *)&table,&local_2a0);
          if (bVar1) {
            ppVar9 = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>
                     ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>
                                   *)&table);
            local_298 = &ppVar9->second;
            std::__cxx11::string::operator=((string *)&meshMatIt,(string *)local_298);
          }
          else {
            pLVar6 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[46]>
                      (&local_438,(char (*) [46])"Collada: No material specified for subgroup <");
            pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_438,&pSubMesh->mMaterial);
            pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar7,(char (*) [16])"> in geometry <");
            pbVar7 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar7,&__x->mMeshOrController);
            pbVar8 = (basic_formatter *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar7,(char (*) [3])0xbb244a);
            Formatter::basic_formatter::operator_cast_to_string(&local_2c0,pbVar8);
            Logger::warn(pLVar6,&local_2c0);
            std::__cxx11::string::~string((string *)&local_2c0);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_438);
            bVar1 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                    ::empty(&__x->mMaterials);
            if (!bVar1) {
              matIt._M_node =
                   (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>_>
                   ::begin(&__x->mMaterials);
              ppVar9 = std::
                       _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>
                       ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::SemanticMappingTable>_>
                                     *)&matIt);
              std::__cxx11::string::operator=((string *)&meshMatIt,(string *)&ppVar9->second);
            }
          }
          iStack_450 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ::find(&this->mMaterialIndexByName,(key_type *)&meshMatIt);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
          ::_Rb_tree_const_iterator(&local_448,&stack0xfffffffffffffbb0);
          local_454 = 0;
          mat = (pair<Assimp::Collada::Effect_*,_aiMaterial_*> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::end(&this->mMaterialIndexByName);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
          ::_Rb_tree_const_iterator(&local_460,(iterator *)&mat);
          bVar1 = std::operator!=(&local_448,&local_460);
          if (bVar1) {
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                      ::operator->(&local_448);
            local_454 = (uint)ppVar10->second;
          }
          if ((local_298 != (SemanticMappingTable *)0x0) &&
             (bVar1 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::InputSemanticMapEntry>_>_>
                      ::empty(&local_298->mMap), !bVar1)) {
            pvVar11 = std::
                      vector<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>,_std::allocator<std::pair<Assimp::Collada::Effect_*,_aiMaterial_*>_>_>
                      ::operator[](&this->newMats,(ulong)local_454);
            ApplyVertexToEffectSemanticMapping(this,&pvVar11->first->mTexDiffuse,local_298);
            ApplyVertexToEffectSemanticMapping(this,&pvVar11->first->mTexAmbient,local_298);
            ApplyVertexToEffectSemanticMapping(this,&pvVar11->first->mTexSpecular,local_298);
            ApplyVertexToEffectSemanticMapping(this,&pvVar11->first->mTexEmissive,local_298);
            ApplyVertexToEffectSemanticMapping(this,&pvVar11->first->mTexTransparent,local_298);
            ApplyVertexToEffectSemanticMapping(this,&pvVar11->first->mTexBump,local_298);
          }
          ColladaMeshIndex::ColladaMeshIndex
                    ((ColladaMeshIndex *)&dstMeshIt,&__x->mMeshOrController,(size_t)submesh,
                     (string *)&meshMatIt);
          local_4c8._M_node =
               (_Base_ptr)
               std::
               map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
               ::find(&this->mMeshIndexByID,(key_type *)&dstMeshIt);
          std::_Rb_tree_const_iterator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>::
          _Rb_tree_const_iterator(&local_4c0,&local_4c8);
          dstMesh = (aiMesh *)
                    std::
                    map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
                    ::end(&this->mMeshIndexByID);
          std::_Rb_tree_const_iterator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>::
          _Rb_tree_const_iterator(&local_4d0,(iterator *)&dstMesh);
          bVar1 = std::operator!=(&local_4c0,&local_4d0);
          if (bVar1) {
            ppVar12 = std::
                      _Rb_tree_const_iterator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>
                      ::operator->(&local_4c0);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                       &ppVar12->second);
          }
          else {
            local_4e0 = CreateMesh(this,pParser,(Mesh *)srcController,pSubMesh,
                                   (Controller *)srcMeshIt._M_node,faceStart,sm);
            local_4e8 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,&local_4e8)
            ;
            sVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->mMeshes);
            pmVar13 = std::
                      map<Assimp::ColladaMeshIndex,_unsigned_long,_std::less<Assimp::ColladaMeshIndex>,_std::allocator<std::pair<const_Assimp::ColladaMeshIndex,_unsigned_long>_>_>
                      ::operator[](&this->mMeshIndexByID,(key_type *)&dstMeshIt);
            *pmVar13 = sVar2;
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->mMeshes,&local_4e0);
            faceStart = local_4e0->mNumVertices + faceStart;
            sm = pSubMesh->mNumFaces + sm;
            local_4e0->mMaterialIndex = local_454;
            if ((local_4e0->mName).length == 0) {
              aiString::operator=(&local_4e0->mName,&__x->mMeshOrController);
            }
          }
          ColladaMeshIndex::~ColladaMeshIndex((ColladaMeshIndex *)&dstMeshIt);
          std::__cxx11::string::~string((string *)&meshMatIt);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::Collada::MeshInstance_*,_std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void ColladaLoader::BuildMeshesForNode(const ColladaParser& pParser, const Collada::Node* pNode, aiNode* pTarget) {
    // accumulated mesh references by this node
    std::vector<size_t> newMeshRefs;
    newMeshRefs.reserve(pNode->mMeshes.size());

    // add a mesh for each subgroup in each collada mesh
    for (const Collada::MeshInstance& mid : pNode->mMeshes) {
        const Collada::Mesh* srcMesh = nullptr;
        const Collada::Controller* srcController = nullptr;

        // find the referred mesh
        ColladaParser::MeshLibrary::const_iterator srcMeshIt = pParser.mMeshLibrary.find(mid.mMeshOrController);
        if (srcMeshIt == pParser.mMeshLibrary.end()) {
            // if not found in the mesh-library, it might also be a controller referring to a mesh
            ColladaParser::ControllerLibrary::const_iterator srcContrIt = pParser.mControllerLibrary.find(mid.mMeshOrController);
            if (srcContrIt != pParser.mControllerLibrary.end()) {
                srcController = &srcContrIt->second;
                srcMeshIt = pParser.mMeshLibrary.find(srcController->mMeshId);
                if (srcMeshIt != pParser.mMeshLibrary.end()) {
                    srcMesh = srcMeshIt->second;
                }
            }


            if( nullptr == srcMesh) {
                ASSIMP_LOG_WARN_F( "Collada: Unable to find geometry for ID \"", mid.mMeshOrController, "\". Skipping." );
                continue;
            }
        }
        else {
            // ID found in the mesh library -> direct reference to an unskinned mesh
            srcMesh = srcMeshIt->second;
        }

        // build a mesh for each of its subgroups
        size_t vertexStart = 0, faceStart = 0;
        for (size_t sm = 0; sm < srcMesh->mSubMeshes.size(); ++sm) {
            const Collada::SubMesh& submesh = srcMesh->mSubMeshes[sm];
            if (submesh.mNumFaces == 0) {
                continue;
            }

            // find material assigned to this submesh
            std::string meshMaterial;
            std::map<std::string, Collada::SemanticMappingTable >::const_iterator meshMatIt = mid.mMaterials.find(submesh.mMaterial);

            const Collada::SemanticMappingTable* table = nullptr;
            if (meshMatIt != mid.mMaterials.end()) {
                table = &meshMatIt->second;
                meshMaterial = table->mMatName;
            }
            else {
                ASSIMP_LOG_WARN_F("Collada: No material specified for subgroup <", submesh.mMaterial, "> in geometry <",
                    mid.mMeshOrController, ">.");
                if (!mid.mMaterials.empty()) {
                    meshMaterial = mid.mMaterials.begin()->second.mMatName;
                }
            }

            // OK ... here the *real* fun starts ... we have the vertex-input-to-effect-semantic-table
            // given. The only mapping stuff which we do actually support is the UV channel.
            std::map<std::string, size_t>::const_iterator matIt = mMaterialIndexByName.find(meshMaterial);
            unsigned int matIdx = 0;
            if (matIt != mMaterialIndexByName.end()) {
                matIdx = static_cast<unsigned int>(matIt->second);
            }

            if (table && !table->mMap.empty()) {
                std::pair<Collada::Effect*, aiMaterial*>&  mat = newMats[matIdx];

                // Iterate through all texture channels assigned to the effect and
                // check whether we have mapping information for it.
                ApplyVertexToEffectSemanticMapping(mat.first->mTexDiffuse, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexAmbient, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexSpecular, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexEmissive, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexTransparent, *table);
                ApplyVertexToEffectSemanticMapping(mat.first->mTexBump, *table);
            }

            // built lookup index of the Mesh-Submesh-Material combination
            ColladaMeshIndex index(mid.mMeshOrController, sm, meshMaterial);

            // if we already have the mesh at the library, just add its index to the node's array
            std::map<ColladaMeshIndex, size_t>::const_iterator dstMeshIt = mMeshIndexByID.find(index);
            if (dstMeshIt != mMeshIndexByID.end()) {
                newMeshRefs.push_back(dstMeshIt->second);
            }
            else {
                // else we have to add the mesh to the collection and store its newly assigned index at the node
                aiMesh* dstMesh = CreateMesh(pParser, srcMesh, submesh, srcController, vertexStart, faceStart);

                // store the mesh, and store its new index in the node
                newMeshRefs.push_back(mMeshes.size());
                mMeshIndexByID[index] = mMeshes.size();
                mMeshes.push_back(dstMesh);
                vertexStart += dstMesh->mNumVertices; faceStart += submesh.mNumFaces;

                // assign the material index
                dstMesh->mMaterialIndex = matIdx;
                if (dstMesh->mName.length == 0) {
                    dstMesh->mName = mid.mMeshOrController;
                }
            }
        }
    }

    // now place all mesh references we gathered in the target node
    pTarget->mNumMeshes = static_cast<unsigned int>(newMeshRefs.size());
    if (newMeshRefs.size()) {
        struct UIntTypeConverter {
            unsigned int operator()(const size_t& v) const {
                return static_cast<unsigned int>(v);
            }
        };

        pTarget->mMeshes = new unsigned int[pTarget->mNumMeshes];
        std::transform(newMeshRefs.begin(), newMeshRefs.end(), pTarget->mMeshes, UIntTypeConverter());
    }
}